

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  secp256k1_fe *psVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  long lVar6;
  secp256k1_fe local_218;
  secp256k1_fe local_1e8;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe local_158;
  secp256k1_fe u2;
  secp256k1_fe h2;
  secp256k1_fe i2;
  secp256k1_fe z12;
  secp256k1_fe s2;
  secp256k1_fe t;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      psVar1 = &a->z;
      secp256k1_fe_sqr(&z12,psVar1);
      u1.n[4] = (a->x).n[4];
      u1.n[0] = (a->x).n[0];
      u1.n[1] = (a->x).n[1];
      u1.n[2] = (a->x).n[2];
      u1.n[3] = (a->x).n[3];
      secp256k1_fe_normalize_weak(&u1);
      secp256k1_fe_mul(&u2,&b->x,&z12);
      s1.n[4] = (a->y).n[4];
      s1.n[0] = (a->y).n[0];
      s1.n[1] = (a->y).n[1];
      s1.n[2] = (a->y).n[2];
      s1.n[3] = (a->y).n[3];
      secp256k1_fe_normalize_weak(&s1);
      secp256k1_fe_mul(&s2,&b->y,&z12);
      secp256k1_fe_mul(&s2,&s2,psVar1);
      local_1e8.n[0] = (u2.n[0] - u1.n[0]) + 0x3ffffbfffff0bc;
      local_1e8.n[1] = (u2.n[1] - u1.n[1]) + 0x3ffffffffffffc;
      local_1e8.n[2] = (u2.n[2] - u1.n[2]) + 0x3ffffffffffffc;
      local_1e8.n[3] = (u2.n[3] - u1.n[3]) + 0x3ffffffffffffc;
      local_1e8.n[4] = (u2.n[4] - u1.n[4]) + 0x3fffffffffffc;
      local_218.n[0] = (s2.n[0] - s1.n[0]) + 0x3ffffbfffff0bc;
      local_218.n[1] = (s2.n[1] - s1.n[1]) + 0x3ffffffffffffc;
      local_218.n[2] = (s2.n[2] - s1.n[2]) + 0x3ffffffffffffc;
      local_218.n[3] = (s2.n[3] - s1.n[3]) + 0x3ffffffffffffc;
      local_218.n[4] = (s2.n[4] - s1.n[4]) + 0x3fffffffffffc;
      iVar5 = secp256k1_fe_normalizes_to_zero_var(&local_1e8);
      if (iVar5 == 0) {
        secp256k1_fe_sqr(&i2,&local_218);
        secp256k1_fe_sqr(&h2,&local_1e8);
        secp256k1_fe_mul(&local_158,&local_1e8,&h2);
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[4] = local_1e8.n[4];
          rzr->n[2] = local_1e8.n[2];
          rzr->n[3] = local_1e8.n[3];
          rzr->n[0] = local_1e8.n[0];
          rzr->n[1] = local_1e8.n[1];
        }
        secp256k1_fe_mul(&r->z,psVar1,&local_1e8);
        secp256k1_fe_mul(&t,&u1,&h2);
        (r->x).n[4] = t.n[4];
        (r->x).n[2] = t.n[2];
        (r->x).n[3] = t.n[3];
        (r->x).n[0] = t.n[0];
        (r->x).n[1] = t.n[1];
        secp256k1_fe_mul_int(&r->x,2);
        secp256k1_fe_add(&r->x,&local_158);
        secp256k1_fe_negate(&r->x,&r->x,3);
        secp256k1_fe_add(&r->x,&i2);
        psVar1 = &r->y;
        secp256k1_fe_negate(psVar1,&r->x,5);
        secp256k1_fe_add(psVar1,&t);
        secp256k1_fe_mul(psVar1,psVar1,&local_218);
        secp256k1_fe_mul(&local_158,&local_158,&s1);
        local_158.n[0] = 0x3ffffbfffff0bc - local_158.n[0];
        local_158.n[1] = 0x3ffffffffffffc - local_158.n[1];
        local_158.n[2] = 0x3ffffffffffffc - local_158.n[2];
        local_158.n[3] = 0x3ffffffffffffc - local_158.n[3];
        local_158.n[4] = 0x3fffffffffffc - local_158.n[4];
        secp256k1_fe_add(psVar1,&local_158);
      }
      else {
        iVar5 = secp256k1_fe_normalizes_to_zero_var(&local_218);
        if (iVar5 == 0) {
          if (rzr != (secp256k1_fe *)0x0) {
            rzr->n[2] = 0;
            rzr->n[3] = 0;
            rzr->n[0] = 0;
            rzr->n[1] = 0;
            rzr->n[4] = 0;
          }
          secp256k1_gej_set_infinity(r);
        }
        else {
          secp256k1_gej_double_var(r,a,rzr);
        }
      }
    }
    else {
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
      }
      for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
        (r->x).n[0] = (a->x).n[0];
        a = (secp256k1_gej *)((a->x).n + 1);
        r = (secp256k1_gej *)((r->x).n + 1);
      }
    }
  }
  else {
    r->infinity = b->infinity;
    uVar2 = (b->x).n[1];
    uVar3 = (b->x).n[2];
    uVar4 = (b->x).n[3];
    (r->x).n[0] = (b->x).n[0];
    (r->x).n[1] = uVar2;
    (r->x).n[2] = uVar3;
    (r->x).n[3] = uVar4;
    (r->x).n[4] = (b->x).n[4];
    uVar2 = (b->y).n[1];
    uVar3 = (b->y).n[2];
    uVar4 = (b->y).n[3];
    (r->y).n[0] = (b->y).n[0];
    (r->y).n[1] = uVar2;
    (r->y).n[2] = uVar3;
    (r->y).n[3] = uVar4;
    (r->y).n[4] = (b->y).n[4];
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* 8 mul, 3 sqr, 4 normalize, 12 mul_int/add/negate */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;
    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }
    r->infinity = 0;

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}